

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtmidiin.cpp
# Opt level: O2

int RtMidiIn_register(lua_State *L)

{
  int iVar1;
  
  iVar1 = luaL_newmetatable(L,"luartmidi.rtmidiin");
  if (iVar1 != 0) {
    lua_pushlstring(L,"__index",7);
    luaNewLib<6ul>(L,(luaL_Reg (*) [6])(anonymous_namespace)::RtMidiIn_mt_index);
    lua_getfield(L,0xfff0b9d8,"luartmidi.rtmidi");
    lua_setmetatable(L,0xfffffffffffffffe);
    lua_rawset(L,0xfffffffd);
    lua_pushlstring(L,"__gc",4);
    lua_pushcclosure(L,anon_unknown.dwarf_112cf::RtMidiIn_dtor,0);
    lua_rawset(L,0xfffffffd);
  }
  lua_settop(L,0xfffffffffffffffe);
  lua_createtable(L,0,0);
  iVar1 = luaL_newmetatable(L,"luartmidi.rtmidiin.__class");
  if (iVar1 != 0) {
    lua_pushlstring(L,"__call",6);
    lua_pushcclosure(L,anon_unknown.dwarf_112cf::RtMidiIn_ctor,0);
    lua_rawset(L,0xfffffffffffffffd);
  }
  lua_setmetatable(L,0xfffffffffffffffe);
  return 1;
}

Assistant:

LUA_RTMIDI_LOCAL int RtMidiIn_register(lua_State *L) {
	// instance methods
	if (luaL_newmetatable(L, MT_RTMIDIIN)) {
		lua_pushliteral(L, "__index");
		luaNewLib(L, RtMidiIn_mt_index);
		luaL_getmetatable(L, MT_RTMIDI);
		lua_setmetatable(L, -2);
		lua_rawset(L, -3);

		lua_pushliteral(L, "__gc");
		lua_pushcfunction(L, RtMidiIn_dtor);
		lua_rawset(L, -3);
	}
	lua_pop(L, 1);

	// constructor
	lua_newtable(L);
	if (luaL_newmetatable(L, MT_RTMIDIIN_CLASS)) {
		lua_pushliteral(L, "__call");
		lua_pushcfunction(L, RtMidiIn_ctor);
		lua_rawset(L, -3);
	}
	lua_setmetatable(L, -2);

	return 1;
}